

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args>_>
                 *this,Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x30);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__FunctionInstance1_00cedeb8;
  pTVar1[1]._vptr_TestInstance = (_func_int **)(this->m_arg0).func;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
            *)&pTVar1[1].m_context,&(this->m_arg0).arg0.bindings);
  return pTVar1;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }